

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

void __thiscall
mapbox::detail::Earcut<unsigned_int>::operator()
          (Earcut<unsigned_int> *this,
          vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
          *points)

{
  pointer paVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_type sVar5;
  double *pdVar6;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *in_RSI;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *in_RDI;
  Earcut<unsigned_int> *unaff_retaddr;
  Node *in_stack_00000010;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *in_stack_00000018;
  Earcut<unsigned_int> *in_stack_00000020;
  Node *p;
  Node *outerNode;
  size_t i;
  size_t len;
  int threshold;
  double y;
  double x;
  pointer local_80;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *in_stack_ffffffffffffff90;
  Node *in_stack_ffffffffffffffa8;
  Earcut<unsigned_int> *in_stack_ffffffffffffffb0;
  Node *local_48;
  Node *local_40;
  size_type local_38;
  int local_24;
  double local_20;
  double local_18;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *points_00;
  
  points_00 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x198886);
  in_RDI[1].super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bVar2 = std::
          vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
          ::empty(in_stack_ffffffffffffff90);
  if (!bVar2) {
    local_24 = 0x50;
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (-1 < local_24) {
        sVar5 = local_38;
        sVar3 = std::
                vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                ::size(in_RSI);
        bVar2 = sVar5 < sVar3;
      }
      if (!bVar2) break;
      pvVar4 = std::
               vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               ::operator[](in_RSI,local_38);
      sVar5 = std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::size
                        (pvVar4);
      local_24 = local_24 - (int)sVar5;
      pvVar4 = std::
               vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               ::operator[](in_RSI,local_38);
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::size(pvVar4);
      local_38 = local_38 + 1;
    }
    ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
    ::reset((ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
             *)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
    pvVar4 = std::
             vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
             ::operator[](in_RSI,0);
    std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::size(pvVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&in_stack_ffffffffffffffb0->indices,(size_type)in_stack_ffffffffffffffa8);
    std::
    vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ::operator[](in_RSI,0);
    local_40 = linkedList<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                         (unaff_retaddr,points_00,SUB81((ulong)in_RSI >> 0x38,0));
    if ((local_40 != (Node *)0x0) && (local_40->prev != local_40->next)) {
      sVar5 = std::
              vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
              ::size(in_RSI);
      if (1 < sVar5) {
        local_40 = eliminateHoles<std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
                             (in_stack_00000020,in_stack_00000018,in_stack_00000010);
      }
      *(bool *)&in_RDI[1].
                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = local_24 < 0;
      if (((ulong)in_RDI[1].
                  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
        local_48 = local_40->next;
        paVar1 = (pointer)local_40->x;
        in_RDI[2].
        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl
        .super__Vector_impl_data._M_start = paVar1;
        in_RDI[1].
        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = paVar1;
        paVar1 = (pointer)local_40->y;
        in_RDI[2].
        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = paVar1;
        in_RDI[2].
        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl
        .super__Vector_impl_data._M_finish = paVar1;
        do {
          local_18 = local_48->x;
          local_20 = local_48->y;
          pdVar6 = std::min<double>((double *)
                                    &in_RDI[1].
                                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_18);
          in_RDI[1].
          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar6;
          pdVar6 = std::min<double>((double *)
                                    &in_RDI[2].
                                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_20);
          in_RDI[2].
          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)*pdVar6;
          pdVar6 = std::max<double>((double *)(in_RDI + 2),&local_18);
          in_RDI[2].
          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)*pdVar6;
          pdVar6 = std::max<double>((double *)
                                    &in_RDI[2].
                                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_20);
          in_RDI[2].
          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar6;
          local_48 = local_48->next;
        } while (local_48 != local_40);
        in_stack_ffffffffffffffb0 =
             (Earcut<unsigned_int> *)
             ((double)in_RDI[2].
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start -
             (double)in_RDI[1].
                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        in_stack_ffffffffffffffa8 =
             (Node *)((double)in_RDI[2].
                              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                     (double)in_RDI[2].
                             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        pdVar6 = std::max<double>((double *)&stack0xffffffffffffffb0,
                                  (double *)&stack0xffffffffffffffa8);
        in_RDI[3].
        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)*pdVar6;
        paVar1 = in_RDI[3].
                 super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((double)paVar1 != 0.0) || (NAN((double)paVar1))) {
          local_80 = (pointer)(1.0 / (double)in_RDI[3].
                                             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          local_80 = (pointer)0x0;
        }
        in_RDI[3].
        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl
        .super__Vector_impl_data._M_start = local_80;
      }
      earcutLinked(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int)((ulong)in_RDI >> 0x20))
      ;
      ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
      ::clear((ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
               *)0x198bc7);
    }
  }
  return;
}

Assistant:

void Earcut<N>::operator()(const Polygon& points) {
    // reset
    indices.clear();
    vertices = 0;

    if (points.empty()) return;

    double x;
    double y;
    int threshold = 80;
    std::size_t len = 0;

    for (size_t i = 0; threshold >= 0 && i < points.size(); i++) {
        threshold -= static_cast<int>(points[i].size());
        len += points[i].size();
    }

    //estimate size of nodes and indices
    nodes.reset(len * 3 / 2);
    indices.reserve(len + points[0].size());

    Node* outerNode = linkedList(points[0], true);
    if (!outerNode || outerNode->prev == outerNode->next) return;

    if (points.size() > 1) outerNode = eliminateHoles(points, outerNode);

    // if the shape is not too simple, we'll use z-order curve hash later; calculate polygon bbox
    hashing = threshold < 0;
    if (hashing) {
        Node* p = outerNode->next;
        minX = maxX = outerNode->x;
        minY = maxY = outerNode->y;
        do {
            x = p->x;
            y = p->y;
            minX = std::min<double>(minX, x);
            minY = std::min<double>(minY, y);
            maxX = std::max<double>(maxX, x);
            maxY = std::max<double>(maxY, y);
            p = p->next;
        } while (p != outerNode);

        // minX, minY and size are later used to transform coords into integers for z-order calculation
        inv_size = std::max<double>(maxX - minX, maxY - minY);
        inv_size = inv_size != .0 ? (1. / inv_size) : .0;
    }

    earcutLinked(outerNode);

    nodes.clear();
}